

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::PrintTestPartResult(TestPartResult *test_part_result)

{
  size_t sVar1;
  int in_ECX;
  internal *this;
  char *pcVar2;
  ostream *poVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string local_58;
  string local_38;
  
  Message::Message((Message *)&local_60);
  this = (internal *)(test_part_result->file_name_)._M_string_length;
  if (this != (internal *)0x0) {
    this = (internal *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  FormatFileLocation_abi_cxx11_
            (&local_38,this,(char *)(ulong)(uint)test_part_result->line_number_,in_ECX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_60._M_head_impl + 0x10),local_38._M_dataplus._M_p,
             local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_60._M_head_impl + 0x10)," ",1);
  if ((ulong)test_part_result->type_ < 4) {
    pcVar2 = &DAT_0013be54 + *(int *)(&DAT_0013be54 + (ulong)test_part_result->type_ * 4);
  }
  else {
    pcVar2 = "Unknown result type";
  }
  poVar3 = (ostream *)(local_60._M_head_impl + 0x10);
  sVar1 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar1);
  pcVar2 = (test_part_result->message_)._M_dataplus._M_p;
  poVar3 = (ostream *)(local_60._M_head_impl + 0x10);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "(null)";
    sVar1 = 6;
  }
  else {
    sVar1 = strlen(pcVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar1);
  StringStreamToString(&local_58,local_60._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  puts(local_58._M_dataplus._M_p);
  fflush(_stdout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void PrintTestPartResult(const TestPartResult& test_part_result) {
  const std::string& result = PrintTestPartResultToString(test_part_result);
  printf("%s\n", result.c_str());
  fflush(stdout);
  // If the test program runs in Visual Studio or a debugger, the
  // following statements add the test part result message to the Output
  // window such that the user can double-click on it to jump to the
  // corresponding source code location; otherwise they do nothing.
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MOBILE)
  // We don't call OutputDebugString*() on Windows Mobile, as printing
  // to stdout is done by OutputDebugString() there already - we don't
  // want the same message printed twice.
  ::OutputDebugStringA(result.c_str());
  ::OutputDebugStringA("\n");
#endif
}